

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

_GLFWwindow * findWindowByHandle(Window handle)

{
  int iVar1;
  undefined8 in_RDI;
  _GLFWwindow *window;
  _GLFWwindow *local_18 [2];
  _GLFWwindow *local_8;
  
  iVar1 = XFindContext(_glfw.x11.display,in_RDI,_glfw.x11.context,local_18);
  if (iVar1 == 0) {
    local_8 = local_18[0];
  }
  else {
    local_8 = (_GLFWwindow *)0x0;
  }
  return local_8;
}

Assistant:

static _GLFWwindow* findWindowByHandle(Window handle)
{
    _GLFWwindow* window;

    if (XFindContext(_glfw.x11.display,
                     handle,
                     _glfw.x11.context,
                     (XPointer*) &window) != 0)
    {
        return NULL;
    }

    return window;
}